

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.cpp
# Opt level: O0

void __thiscall
Preprocessor::preprocess(Preprocessor *this,QByteArray *filename,Symbols *preprocessed)

{
  QByteArrayView ba;
  bool bVar1;
  bool bVar2;
  Token TVar3;
  uint uVar4;
  int iVar5;
  Parser *this_00;
  Symbol *pSVar6;
  const_reference pSVar7;
  int __oflag;
  Preprocessor *in_RDX;
  int __fd;
  Preprocessor *in_RSI;
  QList<Symbol> *in_RDI;
  long in_FS_OFFSET;
  Token token_1;
  qsizetype i;
  Token lastToken;
  qsizetype start;
  qsizetype saveIndex;
  bool local;
  int lineNum;
  Token token;
  Symbol sym;
  QByteArray name_1;
  Macro macro;
  QByteArray name;
  Symbols saveSymbols;
  QByteArray input;
  QFile file;
  QByteArray include;
  rvalue_ref in_stack_fffffffffffffc78;
  undefined4 in_stack_fffffffffffffc80;
  Token in_stack_fffffffffffffc84;
  Parser *in_stack_fffffffffffffc88;
  undefined7 in_stack_fffffffffffffc90;
  byte in_stack_fffffffffffffc97;
  Preprocessor *in_stack_fffffffffffffc98;
  Preprocessor *that;
  Preprocessor *in_stack_fffffffffffffca0;
  undefined4 in_stack_fffffffffffffca8;
  int in_stack_fffffffffffffcac;
  Symbol **in_stack_fffffffffffffcb0;
  Preprocessor *in_stack_fffffffffffffcb8;
  QByteArray *in_stack_fffffffffffffcc8;
  Data *local_2f8;
  Token local_2ec;
  Data *in_stack_fffffffffffffd18;
  QByteArray *input_00;
  Preprocessor *pPVar8;
  undefined1 local_288 [4];
  undefined4 local_284;
  Data *in_stack_fffffffffffffdb0;
  undefined1 local_1e8;
  undefined1 local_1e7;
  QByteArray QStack_1c8;
  undefined1 *local_1b0;
  undefined1 *local_1a8;
  undefined1 *local_1a0;
  undefined1 *local_108;
  undefined1 *local_100;
  undefined1 *local_f8;
  undefined1 *local_f0;
  undefined1 *local_e8;
  undefined1 *local_e0;
  uint local_d4;
  char *local_d0;
  QFile local_a0 [8];
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::stack<QByteArray,_QList<QByteArray>_>::push
            ((stack<QByteArray,_QList<QByteArray>_> *)
             CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80),
             (value_type *)in_stack_fffffffffffffc78);
  that = in_RDX;
  this_00 = (Parser *)QList<Symbol>::size((QList<Symbol> *)in_RDX);
  QList<Symbol>::size(in_RDI);
  QList<Symbol>::reserve
            ((QList<Symbol> *)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8),
             (qsizetype)in_RDX);
LAB_00183bbd:
  do {
    bVar1 = Parser::hasNext((Parser *)CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80))
    ;
    if (!bVar1) {
      std::stack<QByteArray,_QList<QByteArray>_>::pop
                ((stack<QByteArray,_QList<QByteArray>_> *)
                 CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80));
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        return;
      }
LAB_0018486c:
      __stack_chk_fail();
    }
    TVar3 = Parser::next(in_stack_fffffffffffffc88);
    if (TVar3 == IDENTIFIER) {
      in_stack_fffffffffffffca0 = (Preprocessor *)(in_RDI + 1);
      pPVar8 = that;
      pSVar6 = Parser::symbol((Parser *)0x184668);
      in_stack_fffffffffffffcac = pSVar6->lineNum;
      QSet<QByteArray>::QSet((QSet<QByteArray> *)0x18467b);
      in_stack_fffffffffffffc78 = (rvalue_ref)&stack0xfffffffffffffda8;
      macroExpand((Symbols *)in_stack_fffffffffffffca0,that,
                  (Symbols *)CONCAT17(in_stack_fffffffffffffc97,in_stack_fffffffffffffc90),
                  (qsizetype *)in_stack_fffffffffffffc88,in_stack_fffffffffffffc84,
                  SUB41((uint)in_stack_fffffffffffffc80 >> 0x18,0),
                  (QSet<QByteArray> *)in_stack_fffffffffffffdb0);
      QSet<QByteArray>::~QSet((QSet<QByteArray> *)0x1846b6);
      in_stack_fffffffffffffc98 = that;
      that = pPVar8;
      goto LAB_00183bbd;
    }
    if (1 < TVar3 - SIGNALS) {
      if (TVar3 != NEWLINE) {
        if (TVar3 == PP_DEFINE) {
          Parser::next(in_stack_fffffffffffffc88);
          local_1b0 = &DAT_aaaaaaaaaaaaaaaa;
          local_1a8 = &DAT_aaaaaaaaaaaaaaaa;
          local_1a0 = &DAT_aaaaaaaaaaaaaaaa;
          Parser::lexem(in_stack_fffffffffffffc88);
          bVar1 = QByteArray::isEmpty((QByteArray *)0x1841e2);
          if (!bVar1) {
            QByteArray::operator[]((QByteArray *)in_stack_fffffffffffffc78,0x1841f7);
            bVar1 = is_ident_start('\0');
            if (bVar1) {
              memset(&local_1e8,0xaa,0x38);
              Macro::Macro((Macro *)CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80));
              local_1e7 = 0;
              bVar1 = Parser::test(in_stack_fffffffffffffc88,in_stack_fffffffffffffc84);
              if (bVar1) {
                local_1e8 = 1;
                parseDefineArguments
                          ((Preprocessor *)
                           CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8),
                           (Macro *)in_stack_fffffffffffffca0);
              }
              else {
                local_1e8 = 0;
              }
              local_2f8 = in_RDI[1].d.d;
              until((Preprocessor *)CONCAT17(in_stack_fffffffffffffc97,in_stack_fffffffffffffc90),
                    (Token)((ulong)in_stack_fffffffffffffc88 >> 0x20));
              QList<Symbol>::reserve
                        ((QList<Symbol> *)
                         CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8),
                         (qsizetype)in_RDX);
              local_2ec = HASH;
              in_stack_fffffffffffffd18 = local_2f8;
              for (; (long)local_2f8 < (long)((long)&in_RDI[1].d.d[-1].super_QArrayData.alloc + 7);
                  local_2f8 = (Data *)((long)&(local_2f8->super_QArrayData).ref_._q_value.
                                              super___atomic_base<int>._M_i + 1)) {
                pSVar7 = QList<Symbol>::at((QList<Symbol> *)
                                           CONCAT44(in_stack_fffffffffffffc84,
                                                    in_stack_fffffffffffffc80),
                                           (qsizetype)in_stack_fffffffffffffc78);
                TVar3 = pSVar7->token;
                if (TVar3 == PP_WHITESPACE) {
                  if (((local_2ec != PP_HASH) && (local_2ec != HASH)) &&
                     ((local_2ec != PP_HASHHASH && (local_2ec != PP_WHITESPACE))))
                  goto LAB_001843b2;
                }
                else {
                  if (((TVar3 == PP_HASHHASH) &&
                      (bVar1 = QList<Symbol>::isEmpty((QList<Symbol> *)0x18438c), !bVar1)) &&
                     (local_2ec == PP_WHITESPACE)) {
                    QList<Symbol>::pop_back((QList<Symbol> *)0x1843ae);
                  }
LAB_001843b2:
                  in_stack_fffffffffffffcc8 = &QStack_1c8;
                  QList<Symbol>::at((QList<Symbol> *)
                                    CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80),
                                    (qsizetype)in_stack_fffffffffffffc78);
                  QList<Symbol>::append
                            ((QList<Symbol> *)
                             CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80),
                             in_stack_fffffffffffffc78);
                  local_2ec = TVar3;
                }
              }
              while( true ) {
                bVar2 = QList<Symbol>::isEmpty((QList<Symbol> *)0x18441c);
                bVar1 = false;
                if (!bVar2) {
                  pSVar6 = QList<Symbol>::constLast((QList<Symbol> *)in_stack_fffffffffffffc78);
                  bVar1 = true;
                  if (pSVar6->token != PP_WHITESPACE) {
                    pSVar6 = QList<Symbol>::constLast((QList<Symbol> *)in_stack_fffffffffffffc78);
                    bVar1 = pSVar6->token == PP_WHITESPACE;
                  }
                }
                if (!bVar1) break;
                QList<Symbol>::pop_back((QList<Symbol> *)0x18448e);
              }
              bVar1 = QList<Symbol>::isEmpty((QList<Symbol> *)0x1844a4);
              if ((!bVar1) &&
                 ((pSVar6 = QList<Symbol>::constFirst
                                      ((QList<Symbol> *)
                                       CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80)
                                      ), pSVar6->token == PP_HASHHASH ||
                  (pSVar6 = QList<Symbol>::constLast((QList<Symbol> *)in_stack_fffffffffffffc78),
                  pSVar6->token == PP_HASHHASH)))) {
                if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
                  Parser::error(this_00,(char *)in_RDI);
                }
                goto LAB_0018486c;
              }
              in_stack_fffffffffffffcb8 = (Preprocessor *)&in_RDI[5].d.ptr;
              SubArray::SubArray((SubArray *)
                                 CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80),
                                 (QByteArray *)in_stack_fffffffffffffc78);
              QHash<SubArray,_Macro>::insert
                        ((QHash<SubArray,_Macro> *)
                         CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80),
                         (SubArray *)in_stack_fffffffffffffc78,(Macro *)0x184548);
              SubArray::~SubArray((SubArray *)0x184562);
              Macro::~Macro((Macro *)CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80));
              QByteArray::~QByteArray((QByteArray *)0x184587);
              goto LAB_00183bbd;
            }
          }
          if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
            Parser::error(this_00,(char *)in_RDI);
          }
          goto LAB_0018486c;
        }
        if (TVar3 == PP_UNDEF) {
          Parser::next(in_stack_fffffffffffffc88);
          Parser::lexem(in_stack_fffffffffffffc88);
          until((Preprocessor *)CONCAT17(in_stack_fffffffffffffc97,in_stack_fffffffffffffc90),
                (Token)((ulong)in_stack_fffffffffffffc88 >> 0x20));
          in_stack_fffffffffffffcb0 = &in_RDI[5].d.ptr;
          SubArray::SubArray((SubArray *)
                             CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80),
                             (QByteArray *)in_stack_fffffffffffffc78);
          QHash<SubArray,_Macro>::remove
                    ((QHash<SubArray,_Macro> *)in_stack_fffffffffffffcb0,&stack0xfffffffffffffdb0);
          SubArray::~SubArray((SubArray *)0x184628);
          QByteArray::~QByteArray((QByteArray *)0x184640);
        }
        else {
          if (2 < TVar3 - PP_IF) {
            if (TVar3 - PP_ELIF < 2) {
              skipUntilEndif((Preprocessor *)
                             CONCAT17(in_stack_fffffffffffffc97,in_stack_fffffffffffffc90));
            }
            else if (TVar3 != PP_ENDIF) {
              if (TVar3 == PP_INCLUDE) {
                pSVar6 = Parser::symbol((Parser *)0x183ca0);
                iVar5 = pSVar6->lineNum;
                local_20 = &DAT_aaaaaaaaaaaaaaaa;
                local_18 = &DAT_aaaaaaaaaaaaaaaa;
                local_10 = &DAT_aaaaaaaaaaaaaaaa;
                QByteArray::QByteArray((QByteArray *)0x183ce3);
                bVar1 = Parser::test(in_stack_fffffffffffffc88,in_stack_fffffffffffffc84);
                if (bVar1) {
                  Parser::lexem(in_stack_fffffffffffffc88);
                  bVar1 = QByteArray::startsWith
                                    ((QByteArray *)
                                     CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80),
                                     (char)((ulong)in_stack_fffffffffffffc78 >> 0x38));
                  QByteArray::~QByteArray((QByteArray *)0x183d3a);
                  Parser::unquotedLexem(in_stack_fffffffffffffc88);
                  QByteArray::operator=
                            ((QByteArray *)
                             CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80),
                             (QByteArray *)in_stack_fffffffffffffc78);
                  QByteArray::~QByteArray((QByteArray *)0x183d6e);
                  until((Preprocessor *)
                        CONCAT17(in_stack_fffffffffffffc97,in_stack_fffffffffffffc90),
                        (Token)((ulong)in_stack_fffffffffffffc88 >> 0x20));
                  if (bVar1) {
                    QByteArray::QByteArray
                              ((QByteArray *)
                               CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80),
                               (QByteArray *)in_stack_fffffffffffffc78);
                  }
                  else {
                    QByteArray::QByteArray((QByteArray *)0x183dbd);
                  }
                  resolveInclude(in_stack_fffffffffffffcb8,(QByteArray *)in_stack_fffffffffffffcb0,
                                 (QByteArray *)
                                 CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
                  QByteArray::operator=
                            ((QByteArray *)
                             CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80),
                             (QByteArray *)in_stack_fffffffffffffc78);
                  QByteArray::~QByteArray((QByteArray *)0x183e01);
                  QByteArray::~QByteArray((QByteArray *)0x183e0e);
                  bVar1 = QByteArray::isNull((QByteArray *)0x183e1b);
                  if ((!bVar1) &&
                     (bVar1 = QSet<QByteArray>::contains
                                        ((QSet<QByteArray> *)
                                         CONCAT44(in_stack_fffffffffffffc84,
                                                  in_stack_fffffffffffffc80),
                                         (QByteArray *)in_stack_fffffffffffffc78), !bVar1)) {
                    QSet<QByteArray>::insert
                              ((QSet<QByteArray> *)in_stack_fffffffffffffc98,
                               (QByteArray *)
                               CONCAT17(in_stack_fffffffffffffc97,in_stack_fffffffffffffc90));
                    local_a0[0].super_QFileDevice.super_QIODevice._vptr_QIODevice =
                         (_func_int **)&DAT_aaaaaaaaaaaaaaaa;
                    local_a0[0].super_QFileDevice.super_QIODevice.d_ptr._M_t.
                    super___uniq_ptr_impl<QIODevicePrivate,_std::default_delete<QIODevicePrivate>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_QIODevicePrivate_*,_std::default_delete<QIODevicePrivate>_>
                    .super__Head_base<0UL,_QIODevicePrivate_*,_false>._M_head_impl =
                         (__uniq_ptr_data<QIODevicePrivate,_std::default_delete<QIODevicePrivate>,_true,_true>
                          )&DAT_aaaaaaaaaaaaaaaa;
                    local_d0 = QByteArray::constData((QByteArray *)0x183ea6);
                    QByteArrayView::QByteArrayView<const_char_*,_true>
                              ((QByteArrayView *)
                               CONCAT17(in_stack_fffffffffffffc97,in_stack_fffffffffffffc90),
                               (char **)in_stack_fffffffffffffc88);
                    ba.m_data = (storage_type *)this_00;
                    ba.m_size = (qsizetype)in_RDI;
                    QString::fromLocal8Bit(ba);
                    QFile::QFile((QFile *)CONCAT17(in_stack_fffffffffffffc97,
                                                   in_stack_fffffffffffffc90),
                                 (QString *)in_stack_fffffffffffffc88);
                    QString::~QString((QString *)0x183f02);
                    QFlags<QIODeviceBase::OpenModeFlag>::QFlags
                              ((QFlags<QIODeviceBase::OpenModeFlag> *)
                               CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80),
                               (OpenModeFlag)((ulong)in_stack_fffffffffffffc78 >> 0x20));
                    uVar4 = QFile::open(local_a0,(char *)(ulong)local_d4,__oflag);
                    if ((uVar4 & 1) != 0) {
                      local_f0 = &DAT_aaaaaaaaaaaaaaaa;
                      local_e8 = &DAT_aaaaaaaaaaaaaaaa;
                      local_e0 = &DAT_aaaaaaaaaaaaaaaa;
                      __fd = (int)local_a0;
                      readOrMapFile((QFile *)CONCAT44(in_stack_fffffffffffffcac,
                                                      in_stack_fffffffffffffca8));
                      QFileDevice::close(&local_a0[0].super_QFileDevice,__fd);
                      bVar1 = QByteArray::isEmpty((QByteArray *)0x183f98);
                      if (!bVar1) {
                        local_108 = &DAT_aaaaaaaaaaaaaaaa;
                        local_100 = &DAT_aaaaaaaaaaaaaaaa;
                        local_f8 = &DAT_aaaaaaaaaaaaaaaa;
                        QList<Symbol>::QList
                                  ((QList<Symbol> *)
                                   CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80),
                                   (QList<Symbol> *)in_stack_fffffffffffffc78);
                        input_00 = (QByteArray *)in_RDI[1].d.d;
                        cleaned(in_stack_fffffffffffffcc8);
                        QByteArray::operator=
                                  ((QByteArray *)
                                   CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80),
                                   (QByteArray *)in_stack_fffffffffffffc78);
                        QByteArray::~QByteArray((QByteArray *)0x184035);
                        tokenize(input_00,(int)((ulong)in_stack_fffffffffffffd18 >> 0x20),
                                 (TokenizeMode)in_stack_fffffffffffffd18);
                        QList<Symbol>::operator=
                                  ((QList<Symbol> *)
                                   CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80),
                                   (QList<Symbol> *)in_stack_fffffffffffffc78);
                        QList<Symbol>::~QList((QList<Symbol> *)0x184070);
                        QByteArray::clear((QByteArray *)0x18407d);
                        in_RDI[1].d.d = (Data *)0x0;
                        Symbol::Symbol((Symbol *)
                                       CONCAT17(in_stack_fffffffffffffc97,in_stack_fffffffffffffc90)
                                       ,(int)((ulong)in_stack_fffffffffffffc88 >> 0x20),
                                       (Token)in_stack_fffffffffffffc88,
                                       (QByteArray *)
                                       CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80)
                                      );
                        QList<Symbol>::operator+=
                                  ((QList<Symbol> *)
                                   CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80),
                                   in_stack_fffffffffffffc78);
                        Symbol::~Symbol((Symbol *)0x1840c8);
                        preprocess(in_RSI,(QByteArray *)that,(Symbols *)CONCAT44(TVar3,iVar5));
                        Symbol::Symbol((Symbol *)
                                       CONCAT17(in_stack_fffffffffffffc97,in_stack_fffffffffffffc90)
                                       ,(int)((ulong)in_stack_fffffffffffffc88 >> 0x20),
                                       (Token)in_stack_fffffffffffffc88,
                                       (QByteArray *)
                                       CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80)
                                      );
                        QList<Symbol>::operator+=
                                  ((QList<Symbol> *)
                                   CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80),
                                   in_stack_fffffffffffffc78);
                        Symbol::~Symbol((Symbol *)0x184125);
                        QList<Symbol>::operator=
                                  ((QList<Symbol> *)
                                   CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80),
                                   (QList<Symbol> *)in_stack_fffffffffffffc78);
                        in_RDI[1].d.d = (Data *)input_00;
                        QList<Symbol>::~QList((QList<Symbol> *)0x184160);
                      }
                      QByteArray::~QByteArray((QByteArray *)0x18416d);
                    }
                    QFile::~QFile((QFile *)0x18417a);
                  }
                }
                QByteArray::~QByteArray((QByteArray *)0x184187);
              }
              else if (TVar3 == PP_HASH) {
                until((Preprocessor *)CONCAT17(in_stack_fffffffffffffc97,in_stack_fffffffffffffc90),
                      (Token)((ulong)in_stack_fffffffffffffc88 >> 0x20));
              }
              else {
                Parser::symbol((Parser *)0x18482b);
                QList<Symbol>::operator+=
                          ((QList<Symbol> *)
                           CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80),
                           in_stack_fffffffffffffc78);
              }
              goto LAB_00183bbd;
            }
            until((Preprocessor *)CONCAT17(in_stack_fffffffffffffc97,in_stack_fffffffffffffc90),
                  (Token)((ulong)in_stack_fffffffffffffc88 >> 0x20));
            goto LAB_00183bbd;
          }
          do {
            iVar5 = evaluateCondition(in_stack_fffffffffffffc98);
            if ((iVar5 != 0) || (bVar1 = skipBranch(in_stack_fffffffffffffca0), !bVar1))
            goto LAB_00183bbd;
            bVar1 = Parser::test(in_stack_fffffffffffffc88,in_stack_fffffffffffffc84);
          } while (bVar1);
          until((Preprocessor *)CONCAT17(in_stack_fffffffffffffc97,in_stack_fffffffffffffc90),
                (Token)((ulong)in_stack_fffffffffffffc88 >> 0x20));
        }
      }
      goto LAB_00183bbd;
    }
    memset(local_288,0xaa,0x30);
    Parser::symbol((Parser *)0x18476c);
    Symbol::Symbol((Symbol *)CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80),
                   in_stack_fffffffffffffc78);
    in_stack_fffffffffffffc88 = (Parser *)&in_RDI[5].d.ptr;
    SubArray::SubArray((SubArray *)CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80),
                       (char *)in_stack_fffffffffffffc78);
    in_stack_fffffffffffffc97 =
         QHash<SubArray,_Macro>::contains
                   ((QHash<SubArray,_Macro> *)in_stack_fffffffffffffc88,
                    (SubArray *)CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80));
    SubArray::~SubArray((SubArray *)0x1847c3);
    if ((in_stack_fffffffffffffc97 & 1) == 0) {
      local_284 = 0x8b;
      if (TVar3 == SIGNALS) {
        local_284 = 0x8a;
      }
    }
    else {
      local_284 = 1;
    }
    QList<Symbol>::operator+=
              ((QList<Symbol> *)CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80),
               in_stack_fffffffffffffc78);
    Symbol::~Symbol((Symbol *)0x18481a);
  } while( true );
}

Assistant:

void Preprocessor::preprocess(const QByteArray &filename, Symbols &preprocessed)
{
    currentFilenames.push(filename);
    preprocessed.reserve(preprocessed.size() + symbols.size());
    while (hasNext()) {
        Token token = next();

        switch (token) {
        case PP_INCLUDE:
        {
            int lineNum = symbol().lineNum;
            QByteArray include;
            bool local = false;
            if (test(PP_STRING_LITERAL)) {
                local = lexem().startsWith('\"');
                include = unquotedLexem();
            } else
                continue;
            until(PP_NEWLINE);

            include = resolveInclude(include, local ? filename : QByteArray());
            if (include.isNull())
                continue;

            if (Preprocessor::preprocessedIncludes.contains(include))
                continue;
            Preprocessor::preprocessedIncludes.insert(include);

            QFile file(QString::fromLocal8Bit(include.constData()));
            if (!file.open(QFile::ReadOnly))
                continue;

            QByteArray input = readOrMapFile(&file);

            file.close();
            if (input.isEmpty())
                continue;

            Symbols saveSymbols = symbols;
            qsizetype saveIndex = index;

            // phase 1: get rid of backslash-newlines
            input = cleaned(input);

            // phase 2: tokenize for the preprocessor
            symbols = tokenize(input);
            input.clear();

            index = 0;

            // phase 3: preprocess conditions and substitute macros
            preprocessed += Symbol(0, MOC_INCLUDE_BEGIN, include);
            preprocess(include, preprocessed);
            preprocessed += Symbol(lineNum, MOC_INCLUDE_END, include);

            symbols = saveSymbols;
            index = saveIndex;
            continue;
        }
        case PP_DEFINE:
        {
            next();
            QByteArray name = lexem();
            if (name.isEmpty() || !is_ident_start(name[0]))
                error();
            Macro macro;
            macro.isVariadic = false;
            if (test(LPAREN)) {
                // we have a function macro
                macro.isFunction = true;
                parseDefineArguments(&macro);
            } else {
                macro.isFunction = false;
            }
            qsizetype start = index;
            until(PP_NEWLINE);
            macro.symbols.reserve(index - start - 1);

            // remove whitespace where there shouldn't be any:
            // Before and after the macro, after a # and around ##
            Token lastToken = HASH; // skip shitespace at the beginning
            for (qsizetype i = start; i < index - 1; ++i) {
                Token token = symbols.at(i).token;
                if (token == WHITESPACE) {
                    if (lastToken == PP_HASH || lastToken == HASH ||
                        lastToken == PP_HASHHASH ||
                        lastToken == WHITESPACE)
                        continue;
                } else if (token == PP_HASHHASH) {
                    if (!macro.symbols.isEmpty() &&
                        lastToken == WHITESPACE)
                        macro.symbols.pop_back();
                }
                macro.symbols.append(symbols.at(i));
                lastToken = token;
            }
            // remove trailing whitespace
            while (!macro.symbols.isEmpty() &&
                   (macro.symbols.constLast().token == PP_WHITESPACE || macro.symbols.constLast().token == WHITESPACE))
                macro.symbols.pop_back();

            if (!macro.symbols.isEmpty()) {
                if (macro.symbols.constFirst().token == PP_HASHHASH ||
                    macro.symbols.constLast().token == PP_HASHHASH) {
                    error("'##' cannot appear at either end of a macro expansion");
                }
            }
            macros.insert(name, macro);
            continue;
        }
        case PP_UNDEF: {
            next();
            QByteArray name = lexem();
            until(PP_NEWLINE);
            macros.remove(name);
            continue;
        }
        case PP_IDENTIFIER: {
            // substitute macros
            macroExpand(&preprocessed, this, symbols, index, symbol().lineNum, true);
            continue;
        }
        case PP_HASH:
            until(PP_NEWLINE);
            continue; // skip unknown preprocessor statement
        case PP_IFDEF:
        case PP_IFNDEF:
        case PP_IF:
            while (!evaluateCondition()) {
                if (!skipBranch())
                    break;
                if (test(PP_ELIF)) {
                } else {
                    until(PP_NEWLINE);
                    break;
                }
            }
            continue;
        case PP_ELIF:
        case PP_ELSE:
            skipUntilEndif();
            Q_FALLTHROUGH();
        case PP_ENDIF:
            until(PP_NEWLINE);
            continue;
        case PP_NEWLINE:
            continue;
        case SIGNALS:
        case SLOTS: {
            Symbol sym = symbol();
            if (macros.contains("QT_NO_KEYWORDS"))
                sym.token = IDENTIFIER;
            else
                sym.token = (token == SIGNALS ? Q_SIGNALS_TOKEN : Q_SLOTS_TOKEN);
            preprocessed += sym;
        } continue;
        default:
            break;
        }
        preprocessed += symbol();
    }

    currentFilenames.pop();
}